

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_ClippingPlaneData * __thiscall
ON_ClippingPlaneDataList::AppendNew(ON_ClippingPlaneDataList *this)

{
  uint uVar1;
  ON_ClippingPlaneData *this_00;
  ON_ClippingPlaneData *local_18;
  ON_ClippingPlaneData *data;
  ON_ClippingPlaneDataList *this_local;
  
  data = (ON_ClippingPlaneData *)this;
  this_00 = (ON_ClippingPlaneData *)operator_new(0x50);
  ON_ClippingPlaneData::ON_ClippingPlaneData(this_00);
  local_18 = this_00;
  ON_SimpleArray<ON_ClippingPlaneData_*>::Append(&this->m_list,&local_18);
  uVar1 = AppendNew::serial_number + 1;
  local_18->m_sn = AppendNew::serial_number;
  AppendNew::serial_number = uVar1;
  return local_18;
}

Assistant:

ON_ClippingPlaneData* ON_ClippingPlaneDataList::AppendNew()
{
  static unsigned int serial_number = 1;
  ON_ClippingPlaneData* data = new ON_ClippingPlaneData();
  m_list.Append(data);
  data->m_sn = serial_number++;
  return data;
}